

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O0

int DThinker::TickThinkers(FThinkerList *list,FThinkerList *dest)

{
  DThinker *local_30;
  DThinker *node;
  int count;
  FThinkerList *dest_local;
  FThinkerList *list_local;
  
  node._4_4_ = 0;
  local_30 = FThinkerList::GetHead(list);
  if (local_30 == (DThinker *)0x0) {
    list_local._4_4_ = 0;
  }
  else {
    while (local_30 != list->Sentinel) {
      node._4_4_ = node._4_4_ + 1;
      NextToThink = local_30->NextThinker;
      if (((local_30->super_DObject).ObjectFlags & 0x100) == 0) {
        if (dest != (FThinkerList *)0x0) {
          I_Error("There is a thinker in the fresh list that has already ticked.\n");
        }
      }
      else {
        if (dest != (FThinkerList *)0x0) {
          Remove(local_30);
          FThinkerList::AddTail(dest,local_30);
        }
        (*(local_30->super_DObject)._vptr_DObject[8])();
      }
      if (((local_30->super_DObject).ObjectFlags & 0x20) == 0) {
        (*(local_30->super_DObject)._vptr_DObject[7])();
        (local_30->super_DObject).ObjectFlags = (local_30->super_DObject).ObjectFlags & 0xfffffeff;
        GC::CheckGC();
      }
      local_30 = NextToThink;
    }
    list_local._4_4_ = node._4_4_;
  }
  return list_local._4_4_;
}

Assistant:

int DThinker::TickThinkers (FThinkerList *list, FThinkerList *dest)
{
	int count = 0;
	DThinker *node = list->GetHead();

	if (node == NULL)
	{
		return 0;
	}

	while (node != list->Sentinel)
	{
		++count;
		NextToThink = node->NextThinker;
		if (node->ObjectFlags & OF_JustSpawned)
		{
			// Leave OF_JustSpawn set until after Tick() so the ticker can check it.
			if (dest != NULL)
			{ // Move thinker from this list to the destination list
				node->Remove();
				dest->AddTail(node);
			}
			node->PostBeginPlay();
		}
		else if (dest != NULL)
		{
			I_Error("There is a thinker in the fresh list that has already ticked.\n");
		}

		if (!(node->ObjectFlags & OF_EuthanizeMe))
		{ // Only tick thinkers not scheduled for destruction
			node->Tick();
			node->ObjectFlags &= ~OF_JustSpawned;
			GC::CheckGC();
		}
		node = NextToThink;
	}
	return count;
}